

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong local_50;
  
  if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix",(char *)0x0
         );
  }
  uVar1 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  uVar2 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (uVar1 != uVar3) {
    Error("SubstitutionLU <incompatible dimensions>",(char *)0x0);
  }
  if (0 < (long)uVar1) {
    uVar7 = 0;
    do {
      if (0 < (long)uVar2) {
        plVar4 = this->fElem;
        uVar8 = 0;
        do {
          if (uVar7 != 0) {
            plVar5 = B->fElem;
            lVar11 = (uVar8 & 0xffffffff) * uVar1;
            lVar12 = plVar5[lVar11 + uVar7];
            uVar13 = 0;
            do {
              lVar12 = lVar12 - *(long *)((long)plVar5 +
                                         uVar13 * 8 + (uVar8 & 0xffffffff) * uVar1 * 8) *
                                plVar4[uVar7 + (uVar13 & 0xffffffff) * uVar3];
              plVar5[lVar11 + uVar7] = lVar12;
              uVar13 = uVar13 + 1;
            } while (uVar7 != uVar13);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1);
  }
  if (0 < (long)uVar2) {
    local_50 = 0;
    do {
      if (0 < (long)uVar1) {
        lVar14 = ((local_50 & 0xffffffff) * 8 + 8) * uVar1;
        lVar12 = (local_50 & 0xffffffff) * uVar1;
        lVar11 = 0;
        uVar7 = uVar1;
        do {
          uVar8 = uVar7 - 1;
          if ((long)uVar7 < (long)uVar1) {
            plVar4 = B->fElem;
            plVar5 = this->fElem;
            lVar9 = plVar4[lVar12 + uVar8];
            lVar10 = 0;
            do {
              lVar9 = lVar9 - *(long *)((long)plVar4 + lVar10 * 8 + lVar14) *
                              plVar5[uVar8 + (uint)((int)lVar10 + (int)uVar7) * uVar3];
              plVar4[lVar12 + uVar8] = lVar9;
              lVar10 = lVar10 + 1;
            } while (lVar11 != lVar10);
          }
          lVar9 = (uVar8 & 0xffffffff) * uVar3 + uVar8;
          if (this->fElem[lVar9] == 0) {
            Error("BackSub(SubstitutionLU) <Matrix is singular",(char *)0x0);
          }
          B->fElem[lVar12 + uVar8] = B->fElem[lVar12 + uVar8] / this->fElem[lVar9];
          lVar11 = lVar11 + 1;
          lVar14 = lVar14 + -8;
          bVar6 = 1 < (long)uVar7;
          uVar7 = uVar8;
        } while (bVar6);
      }
      local_50 = local_50 + 1;
    } while (local_50 != uVar2);
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B ) const {
#ifdef USING_LAPACK    
	if (this->fDecomposed != ELUPivot) {
		Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
	}
#else
	if(this->fDecomposed != ELU) {
        Error("TPZFMatrix::Decompose_LU substitution called for a wrongly decomposed matrix");
    }
#endif
    int64_t rowb = B->Rows();
    int64_t colb = B->Cols();
    int64_t row = this->Rows();
    if ( rowb != this->Rows() ) Error( "SubstitutionLU <incompatible dimensions>" );
    
    
    int64_t i,j;
    for ( i = 0; i < rowb; i++ ) {
        for ( int64_t col = 0; col < colb; col++ )
            for (j = 0; j < i; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
    }
    
    for (int64_t col=0; col<colb; col++){
        for ( i = rowb-1; i >= 0; i-- ) {
            for (j = i+1; j < rowb ; j++ )
                //B->PutVal( i, col, B->GetVal(i, col) - GetVal(i, j) * B->GetVal(j, col) );
                PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col) - GETVAL(this, row, i, j) * GETVAL(B, rowb, j, col));
            if ( IsZero( GETVAL(this, row, i, i)/*GetVal(i, i)*/ ) ) {
                if (fabs(GETVAL(this, row, i, i)/*GetVal(i, i)*/) > 0.){
                    TVar diff = GETVAL(B, rowb, i, col) - GETVAL(this, row, i, i)/*B->GetVal(i, col) - GetVal(i, i)*/;
                    if (fabs(diff) > 1e-12){
                        Error( "BackSub(SubstitutionLU) <Matrix is singular even after Power Plus..." );
                    }
                }else  Error( "BackSub(SubstitutionLU) <Matrix is singular" );
            }
            PUTVAL(B, rowb, i, col, GETVAL(B, rowb, i, col)/GETVAL(this, row, i, i));
            //B->PutVal( i, col, B->GetVal( i, col) / GetVal(i, i) );
        }
    }
    return( 1 );
    
}